

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O3

void __thiscall
antlr::TokenStreamRecognitionException::~TokenStreamRecognitionException
          (TokenStreamRecognitionException *this)

{
  ~TokenStreamRecognitionException(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

string toString() const
	{
		return recog.getFileLineColumnString()+getMessage();
	}